

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunner.cpp
# Opt level: O3

bool __thiscall
CommandLineTestRunner::parseArguments(CommandLineTestRunner *this,TestPlugin *plugin)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  SimpleString *pSVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestOutput *pTVar5;
  undefined4 extraout_var_02;
  char *pcVar6;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_01;
  
  bVar1 = CommandLineArguments::parse(this->arguments_,plugin);
  if (bVar1) {
    bVar2 = CommandLineArguments::isJUnitOutput(this->arguments_);
    if (bVar2) {
      pSVar4 = CommandLineArguments::getPackageName(this->arguments_);
      iVar3 = (*this->_vptr_CommandLineTestRunner[3])(this,pSVar4);
      this->output_ = (TestOutput *)CONCAT44(extraout_var,iVar3);
      bVar2 = CommandLineArguments::isVerbose(this->arguments_);
      if (!bVar2) {
        return bVar1;
      }
      pTVar5 = this->output_;
      iVar3 = (*this->_vptr_CommandLineTestRunner[4])(this);
      iVar3 = (*this->_vptr_CommandLineTestRunner[5])(this,pTVar5,CONCAT44(extraout_var_00,iVar3));
      pTVar5 = (TestOutput *)CONCAT44(extraout_var_01,iVar3);
    }
    else {
      bVar2 = CommandLineArguments::isTeamCityOutput(this->arguments_);
      if (bVar2) {
        iVar3 = (*this->_vptr_CommandLineTestRunner[2])();
        pTVar5 = (TestOutput *)CONCAT44(extraout_var_03,iVar3);
      }
      else {
        iVar3 = (*this->_vptr_CommandLineTestRunner[4])(this);
        pTVar5 = (TestOutput *)CONCAT44(extraout_var_04,iVar3);
      }
    }
    this->output_ = pTVar5;
  }
  else {
    iVar3 = (*this->_vptr_CommandLineTestRunner[4])(this);
    pTVar5 = (TestOutput *)CONCAT44(extraout_var_02,iVar3);
    this->output_ = pTVar5;
    bVar2 = CommandLineArguments::needHelp(this->arguments_);
    if (bVar2) {
      pcVar6 = CommandLineArguments::help(this->arguments_);
    }
    else {
      pcVar6 = CommandLineArguments::usage(this->arguments_);
    }
    (*pTVar5->_vptr_TestOutput[0xb])(pTVar5,pcVar6);
  }
  return bVar1;
}

Assistant:

bool CommandLineTestRunner::parseArguments(TestPlugin* plugin)
{
  if (!arguments_->parse(plugin)) {
    output_ = createConsoleOutput();
    output_->print((arguments_->needHelp()) ? arguments_->help() : arguments_->usage());
    return false;
  }

  if (arguments_->isJUnitOutput()) {
    output_= createJUnitOutput(arguments_->getPackageName());
    if (arguments_->isVerbose())
      output_ = createCompositeOutput(output_, createConsoleOutput());
  } else if (arguments_->isTeamCityOutput()) {
    output_ = createTeamCityOutput();
  } else
    output_ = createConsoleOutput();
  return true;
}